

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

void __thiscall
QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
          (QVarLengthArray<(anonymous_namespace)::Part,_32LL> *this,Part *t)

{
  qsizetype *pqVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 *paVar2;
  undefined1 *__src;
  void *pvVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  QVLAStorage<24UL,_8UL,_32LL> *__dest;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.s;
  if (lVar6 == (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.a) {
    lVar5 = lVar6 * 2;
    local_40 = lVar6 + 1;
    if (lVar5 - local_40 != 0 && local_40 <= lVar5) {
      local_40 = lVar5;
    }
    __src = (undefined1 *)(this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.ptr
    ;
    if (local_40 < 0x21) {
      lVar5 = 0x20;
      __dest = &this->super_QVLAStorage<24UL,_8UL,_32LL>;
    }
    else {
      __dest = (QVLAStorage<24UL,_8UL,_32LL> *)QtPrivate::fittedMalloc(0,&local_40,0x18,0);
      lVar5 = local_40;
      if (__dest == (QVLAStorage<24UL,_8UL,_32LL> *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          qBadAlloc();
        }
        goto LAB_002fa147;
      }
    }
    if (lVar6 != 0) {
      memcpy(__dest,__src,lVar6 * 0x18);
    }
    (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.ptr = __dest;
    (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.a = lVar5;
    (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.s = lVar6;
    if ((QVLAStorage<24UL,_8UL,_32LL> *)__src != __dest &&
        (QVLAStorage<24UL,_8UL,_32LL> *)__src != &this->super_QVLAStorage<24UL,_8UL,_32LL>) {
      QtPrivate::sizedFree(__src,lVar6 * 0x18);
      lVar6 = (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.s;
    }
  }
  pvVar3 = (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.ptr;
  *(undefined8 *)((long)pvVar3 + lVar6 * 0x18 + 0x10) = *(undefined8 *)&t->number;
  aVar4 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(t->string).m_size;
  paVar2 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)((long)pvVar3 + lVar6 * 0x18);
  *paVar2 = (t->string).field_0;
  paVar2[1] = aVar4;
  pqVar1 = &(this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.s;
  *pqVar1 = *pqVar1 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002fa147:
  __stack_chk_fail();
}

Assistant:

void push_back(T &&t) { append(std::move(t)); }